

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_polycurve.cpp
# Opt level: O1

bool __thiscall ON_PolyCurve::IsLinear(ON_PolyCurve *this,double tolerance)

{
  uint uVar1;
  ON_Curve *pOVar2;
  char cVar3;
  int iVar4;
  ulong uVar5;
  bool bVar6;
  
  uVar1 = (this->m_segment).super_ON_SimpleArray<ON_Curve_*>.m_count;
  if ((ulong)uVar1 == 1) {
    iVar4 = (*((*(this->m_segment).super_ON_SimpleArray<ON_Curve_*>.m_a)->super_ON_Geometry).
              super_ON_Object._vptr_ON_Object[0x2e])();
    return SUB41(iVar4,0);
  }
  if ((int)uVar1 < 2) {
    cVar3 = '\0';
  }
  else {
    uVar5 = 1;
    do {
      pOVar2 = (this->m_segment).super_ON_SimpleArray<ON_Curve_*>.m_a[uVar5 - 1];
      if (pOVar2 == (ON_Curve *)0x0) {
        cVar3 = '\0';
      }
      else {
        iVar4 = (*(pOVar2->super_ON_Geometry).super_ON_Object._vptr_ON_Object[0x2e])(tolerance);
        cVar3 = (char)iVar4;
      }
    } while ((cVar3 != '\0') && (bVar6 = uVar5 < uVar1, uVar5 = uVar5 + 1, bVar6));
    if (cVar3 != '\0') {
      cVar3 = ON_Curve::IsLinear(&this->super_ON_Curve,tolerance);
    }
  }
  return (bool)cVar3;
}

Assistant:

bool
ON_PolyCurve::IsLinear( // true if curve locus is a line segment
      double tolerance // tolerance to use when checking linearity
      ) const
{
  bool rc = false;
  int i, count = Count();
	if ( count==1)
		return m_segment[0]->IsLinear(tolerance);
  
	else if ( count > 1 ) {
    rc = true;
    for ( i = 0; rc && i < count; i++ ) {
      if ( !m_segment[i] )
        rc = false;
      else
        rc = m_segment[i]->IsLinear(tolerance);
    
    }
    if (rc)
      rc = ON_Curve::IsLinear(tolerance);
  }
  return rc;
}